

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraKateGenerator::AppendTarget
          (cmExtraKateGenerator *this,cmGeneratedFileStream *fout,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,string *make,string *makeArgs,string *path,string *homeOutputDir)

{
  bool bVar1;
  cmGeneratedFileStream *pcVar2;
  undefined1 uVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  string *psVar6;
  long *plVar7;
  long *plVar8;
  pointer pbVar9;
  long *local_100;
  long local_f8;
  long local_f0;
  undefined8 uStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  undefined8 uStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  cmExtraKateGenerator *local_60;
  pointer local_58;
  string *local_50;
  string *local_48;
  cmGeneratedFileStream *local_40;
  ulong local_38;
  
  pbVar9 = (configs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (configs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_60 = this;
  local_50 = makeArgs;
  local_48 = make;
  local_40 = fout;
  if (pbVar9 != local_58) {
    do {
      pcVar2 = local_40;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_40,"\t\t\t",3);
      uVar3 = 0x20;
      if (AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
          ::JsonSep != '\0') {
        uVar3 = 0x2c;
      }
      local_100 = (long *)CONCAT71(local_100._1_7_,uVar3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)pcVar2,(char *)&local_100,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\"name\":\"",9);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(target->_M_dataplus)._M_p,target->_M_string_length);
      local_38 = (long)(configs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(configs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
      if (local_38 < 0x21) {
        plVar7 = &local_f0;
        plVar8 = &local_f8;
        local_100 = plVar7;
      }
      else {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_80,":","");
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)local_80,(ulong)(pbVar9->_M_dataplus)._M_p)
        ;
        local_100 = &local_f0;
        plVar7 = puVar5 + 2;
        if ((long *)*puVar5 == plVar7) {
          local_f0 = *plVar7;
          uStack_e8 = puVar5[3];
        }
        else {
          local_f0 = *plVar7;
          local_100 = (long *)*puVar5;
        }
        plVar8 = puVar5 + 1;
        local_f8 = puVar5[1];
        *puVar5 = plVar7;
      }
      *plVar8 = 0;
      *(undefined1 *)plVar7 = 0;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_100,local_f8)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\", \"build_cmd\":\"",0x10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_48->_M_dataplus)._M_p,local_48->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," -C \\\"",6);
      psVar6 = path;
      if (this->UseNinja != false) {
        psVar6 = homeOutputDir;
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\\\" ",3);
      if ((this->UseNinja == true) &&
         (0x20 < (ulong)((long)(configs->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(configs->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start))) {
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0," -f build-","");
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_a0,(ulong)(pbVar9->_M_dataplus)._M_p);
        local_c0 = &local_b0;
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_b0 = *plVar8;
          lStack_a8 = plVar7[3];
        }
        else {
          local_b0 = *plVar8;
          local_c0 = (long *)*plVar7;
        }
        local_b8 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
        plVar7 = puVar5 + 2;
        if ((long *)*puVar5 == plVar7) {
          local_d0 = *plVar7;
          uStack_c8 = puVar5[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0 = *plVar7;
          local_e0 = (long *)*puVar5;
        }
        plVar8 = puVar5 + 1;
        local_d8 = puVar5[1];
        *puVar5 = plVar7;
        bVar1 = true;
      }
      else {
        plVar7 = &local_d0;
        bVar1 = false;
        plVar8 = &local_d8;
        local_e0 = plVar7;
      }
      *plVar8 = 0;
      *(undefined1 *)plVar7 = 0;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_e0,local_d8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_50->_M_dataplus)._M_p,local_50->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(target->_M_dataplus)._M_p,target->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"}\n",3);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      this = local_60;
      if (bVar1) {
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0 + 1);
      }
      if ((0x20 < local_38) && (local_80[0] != local_70)) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::JsonSep = '\x01';
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_58);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& target,
  const std::vector<std::string>& configs, const std::string& make,
  const std::string& makeArgs, const std::string& path,
  const std::string& homeOutputDir) const
{
  static char JsonSep = ' ';

  for (const std::string& conf : configs) {
    fout << "\t\t\t" << JsonSep << R"({"name":")" << target
         << ((configs.size() > 1) ? (std::string(":") + conf) : std::string())
         << "\", "
            "\"build_cmd\":\""
         << make << " -C \\\"" << (this->UseNinja ? homeOutputDir : path)
         << "\\\" "
         << ((this->UseNinja && configs.size() > 1)
               ? std::string(" -f build-") + conf + ".ninja"
               : std::string())
         << makeArgs << " " << target << "\"}\n";

    JsonSep = ',';
  }
}